

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::Dimension::MergeFrom(Dimension *this,Dimension *from)

{
  ulong uVar1;
  LogMessage *other;
  Dimension_UnknownDimension *this_00;
  Dimension_ConstantDimension *this_01;
  undefined1 *puVar2;
  Arena *pAVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/MIL.pb.cc"
               ,0x1406);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (from->_oneof_case_[0] != 1) {
    if (from->_oneof_case_[0] != 2) goto LAB_00208bc4;
    if (this->_oneof_case_[0] == 2) {
      this_00 = (this->dimension_).unknown_;
LAB_00208b6d:
      puVar2 = (undefined1 *)(from->dimension_).unknown_;
    }
    else {
      clear_dimension(this);
      this->_oneof_case_[0] = 2;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_00 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MILSpec::Dimension_UnknownDimension>
                          (pAVar3);
      (this->dimension_).unknown_ = this_00;
      if (from->_oneof_case_[0] == 2) goto LAB_00208b6d;
      puVar2 = _Dimension_UnknownDimension_default_instance_;
    }
    Dimension_UnknownDimension::MergeFrom(this_00,(Dimension_UnknownDimension *)puVar2);
    goto LAB_00208bc4;
  }
  if (this->_oneof_case_[0] == 1) {
    this_01 = (this->dimension_).constant_;
LAB_00208ba4:
    puVar2 = (undefined1 *)(from->dimension_).constant_;
  }
  else {
    clear_dimension(this);
    this->_oneof_case_[0] = 1;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar3 = *(Arena **)pAVar3;
    }
    this_01 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::MILSpec::Dimension_ConstantDimension>
                        (pAVar3);
    (this->dimension_).constant_ = this_01;
    if (from->_oneof_case_[0] == 1) goto LAB_00208ba4;
    puVar2 = _Dimension_ConstantDimension_default_instance_;
  }
  Dimension_ConstantDimension::MergeFrom(this_01,(Dimension_ConstantDimension *)puVar2);
LAB_00208bc4:
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void Dimension::MergeFrom(const Dimension& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.Dimension)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.dimension_case()) {
    case kConstant: {
      _internal_mutable_constant()->::CoreML::Specification::MILSpec::Dimension_ConstantDimension::MergeFrom(from._internal_constant());
      break;
    }
    case kUnknown: {
      _internal_mutable_unknown()->::CoreML::Specification::MILSpec::Dimension_UnknownDimension::MergeFrom(from._internal_unknown());
      break;
    }
    case DIMENSION_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}